

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O3

trade_sign helix::nasdaq::itch_trade_sign(side_type s)

{
  invalid_argument *this;
  trade_sign tVar1;
  undefined7 in_register_00000039;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  tVar1 = (trade_sign)CONCAT71(in_register_00000039,s);
  if (tVar1 != seller_initiated) {
    if (tVar1 != crossing) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"invalid argument","");
      std::invalid_argument::invalid_argument(this,(string *)local_40);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    tVar1 = buyer_initiated;
  }
  return tVar1;
}

Assistant:

trade_sign itch_trade_sign(side_type s)
{
    switch (s) {
    case side_type::buy:  return trade_sign::seller_initiated;
    case side_type::sell: return trade_sign::buyer_initiated;
    default:              throw invalid_argument(string("invalid argument"));
    }
}